

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Reader.cpp
# Opt level: O2

StepStatus __thiscall
adios2::core::engine::BP5Reader::CheckForNewSteps(BP5Reader *this,Seconds timeoutSeconds)

{
  ulong uVar1;
  bool bVar2;
  StepStatus SVar3;
  BP5Reader *this_00;
  TimePoint TVar4;
  double dVar5;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  Seconds local_60;
  double local_58;
  ulong uStack_50;
  TimePoint timeoutInstant;
  Seconds local_40;
  Seconds local_38;
  
  uStack_50 = ~CONCAT44(in_XMM0_Dd,in_XMM0_Dc) & CONCAT44(in_XMM0_Dd,in_XMM0_Dc);
  local_58 = (double)(~-(ulong)(timeoutSeconds.__r < 0.0) & (ulong)timeoutSeconds.__r |
                     -(ulong)(timeoutSeconds.__r < 0.0) & 0x41cdcd64ff800000);
  local_40.__r = local_58;
  TVar4 = Now();
  timeoutInstant.__d.__r = (duration)(local_58 * 1000000000.0 + (double)TVar4.__d.__r);
  dVar5 = (double)(this->super_BP5Engine).m_Parameters.BeginStepPollingFrequencySecs;
  local_38.__r = local_58;
  if (dVar5 <= local_58) {
    local_38.__r = dVar5;
  }
  uVar1 = this->m_StepsCount;
  local_58 = local_38.__r / 10.0;
  do {
    local_60.__r = local_58;
    UpdateBuffer(this,&timeoutInstant,&local_60,&local_40);
    if (uVar1 < this->m_StepsCount) break;
    this_00 = this;
    bVar2 = CheckWriterActive(this);
    if (!bVar2) {
      local_60.__r = local_58;
      UpdateBuffer(this,&timeoutInstant,&local_60,&local_40);
      break;
    }
    bVar2 = SleepOrQuit(this_00,&timeoutInstant,&local_38);
  } while (bVar2);
  SVar3 = OK;
  if (this->m_StepsCount <= uVar1) {
    ((this->super_Engine).m_IO)->m_ReadStreaming = false;
    SVar3 = EndOfStream - this->m_WriterIsActive;
  }
  return SVar3;
}

Assistant:

StepStatus BP5Reader::CheckForNewSteps(Seconds timeoutSeconds)
{
    /* Do a collective wait for a step within timeout.
       Make sure every reader comes to the same conclusion */
    StepStatus retval = StepStatus::OK;

    if (timeoutSeconds < Seconds::zero())
    {
        timeoutSeconds = Seconds(999999999); // max 1 billion seconds wait
    }
    const TimePoint timeoutInstant = Now() + timeoutSeconds;

    auto pollSeconds = Seconds(m_Parameters.BeginStepPollingFrequencySecs);
    if (pollSeconds > timeoutSeconds)
    {
        pollSeconds = timeoutSeconds;
    }

    /* Poll */
    const auto stepsBefore = m_StepsCount;
    do
    {
        UpdateBuffer(timeoutInstant, pollSeconds / 10, timeoutSeconds);
        if (m_StepsCount > stepsBefore)
        {
            break;
        }
        if (!CheckWriterActive())
        {
            /* Race condition: When checking data in UpdateBuffer, new
             * step(s) may have not arrived yet. When checking active flag,
             * the writer may have completed write and terminated. So we may
             * have missed a step or two. */
            UpdateBuffer(timeoutInstant, pollSeconds / 10, timeoutSeconds);
            break;
        }
    } while (SleepOrQuit(timeoutInstant, pollSeconds));

    if (m_StepsCount > stepsBefore)
    {
        /* we have got new steps and new metadata in memory */
        retval = StepStatus::OK;
    }
    else
    {
        m_IO.m_ReadStreaming = false;
        if (m_WriterIsActive)
        {
            retval = StepStatus::NotReady;
        }
        else
        {
            retval = StepStatus::EndOfStream;
        }
    }
    return retval;
}